

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void fe_neg(fe_loose *h,fe *f)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint _assert_fe_i;
  long lVar6;
  
  lVar6 = 0;
  do {
    if (lVar6 == 5) {
      uVar2 = f->v[4];
      uVar3 = f->v[1];
      uVar4 = f->v[2];
      uVar5 = f->v[3];
      h->v[0] = 0xfffffffffffda - f->v[0];
      h->v[1] = 0xffffffffffffe - uVar3;
      h->v[2] = 0xffffffffffffe - uVar4;
      h->v[3] = 0xffffffffffffe - uVar5;
      h->v[4] = 0xffffffffffffe - uVar2;
      lVar6 = 0;
      do {
        if (lVar6 == 5) {
          return;
        }
        puVar1 = h->v + lVar6;
        lVar6 = lVar6 + 1;
      } while (*puVar1 < 0x1a666666666665);
      __assert_fail("constant_time_declassify_int(h->v[_assert_fe_i] <= 0x1a666666666664UL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0x117,"void fe_neg(fe_loose *, const fe *)");
    }
    puVar1 = f->v + lVar6;
    lVar6 = lVar6 + 1;
  } while (*puVar1 < 0x8cccccccccccd);
  __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0x115,"void fe_neg(fe_loose *, const fe *)");
}

Assistant:

static void fe_neg(fe_loose *h, const fe *f) {
  assert_fe(f->v);
  fiat_25519_opp(h->v, f->v);
  assert_fe_loose(h->v);
}